

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.cpp
# Opt level: O0

size_t __thiscall luna::Function::AddInstruction(Function *this,Instruction i,int line)

{
  size_type sVar1;
  undefined4 in_EDX;
  vector<int,_std::allocator<int>_> *in_RDI;
  undefined4 in_stack_ffffffffffffffe8;
  vector<int,_std::allocator<int>_> *this_00;
  
  this_00 = in_RDI;
  std::vector<luna::Instruction,_std::allocator<luna::Instruction>_>::push_back
            ((vector<luna::Instruction,_std::allocator<luna::Instruction>_> *)in_RDI,
             (value_type *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  std::vector<int,_std::allocator<int>_>::push_back
            (this_00,(value_type_conflict *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  sVar1 = std::vector<luna::Instruction,_std::allocator<luna::Instruction>_>::size
                    ((vector<luna::Instruction,_std::allocator<luna::Instruction>_> *)(in_RDI + 1));
  return sVar1 - 1;
}

Assistant:

std::size_t Function::AddInstruction(Instruction i, int line)
    {
        opcodes_.push_back(i);
        opcode_lines_.push_back(line);
        return opcodes_.size() - 1;
    }